

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O2

IntegralConvertResult
absl::lts_20250127::str_format_internal::FormatConvertImpl
          (string_view v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  IntegralConvertResult IVar1;
  
  IVar1.value = anon_unknown_53::ConvertStringArg(v,conv,sink);
  return (IntegralConvertResult)IVar1.value;
}

Assistant:

StringConvertResult FormatConvertImpl(string_view v,
                                      const FormatConversionSpecImpl conv,
                                      FormatSinkImpl *sink) {
  return {ConvertStringArg(v, conv, sink)};
}